

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void __thiscall
gl4cts::GLSL420Pack::LineNumberingTest::prepareShaderSource
          (LineNumberingTest *this,SHADER_STAGES in_stage,bool in_use_version_400,
          shaderSource *out_source)

{
  TestError *this_00;
  char *text;
  char *pcVar1;
  GLchar **ppGVar2;
  size_t position;
  
  if (in_stage < SHADER_STAGES_MAX) {
    std::__cxx11::string::assign
              ((char *)(out_source->m_parts).
                       super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                       ._M_impl.super__Vector_impl_data._M_start);
    position = 0;
    pcVar1 = "#version 420";
    if (in_use_version_400) {
      pcVar1 = 
      "#version 400\n#extension GL_ARB_shading_language_420pack : require\n#extension GL_ARB_separate_shader_objects : enable"
      ;
    }
    ppGVar2 = prepareShaderSource::test_result_snippet_normal;
    if (in_use_version_400) {
      ppGVar2 = prepareShaderSource::test_result_snippet_400;
    }
    text = "#version 430";
    if (in_stage != COMPUTE_SHADER) {
      text = pcVar1;
    }
    Utils::replaceToken("VERSION",&position,text,
                        &((out_source->m_parts).
                          super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_code);
    Utils::replaceToken("GLSL_TEST_FUNCTION",&position,
                        "ivec4 glsl\\\nTest\\\nFunction(in ivec3 arg)\n{\n    return ivec4(__LINE__, arg.xyz);\n}\n"
                        ,&((out_source->m_parts).
                           super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_code);
    Utils::replaceToken("GLSL_TEST_RESULT",&position,ppGVar2[in_stage],
                        &((out_source->m_parts).
                          super__Vector_base<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart,_std::allocator<gl4cts::GLSL420Pack::Utils::shaderSource::shaderPart>_>
                          ._M_impl.super__Vector_impl_data._M_start)->m_code);
    return;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Invalid enum",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShadingLanguage420PackTests.cpp"
             ,0xdcd);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void LineNumberingTest::prepareShaderSource(Utils::SHADER_STAGES in_stage, bool in_use_version_400,
											Utils::shaderSource& out_source)
{
	static const GLchar* test_result_snippet_normal[6] = { /* Utils::COMPUTE_SHADER */
														   "ivec4(11, 1, 2, 3)",
														   /* Utils::VERTEX_SHADER */
														   "ivec4(9, 1, 2, 3)",
														   /* Utils::TESS_CTRL_SHADER */
														   "ivec4(12, 1, 2, 3)",
														   /* Utils::TESS_EVAL_SHADER */
														   "ivec4(12, 1, 2, 3)",
														   /* Utils::GEOMETRY_SHADER */
														   "ivec4(13, 1, 2, 3)",
														   /* Utils::FRAGMENT_SHADER */
														   "ivec4(10, 1, 2, 3)"
	};

	static const GLchar* test_result_snippet_400[6] = { /* Utils::COMPUTE_SHADER */
														"ivec4(13, 1, 2, 3)",
														/* Utils::VERTEX_SHADER */
														"ivec4(11, 1, 2, 3)",
														/* Utils::TESS_CTRL_SHADER */
														"ivec4(14, 1, 2, 3)",
														/* Utils::TESS_EVAL_SHADER */
														"ivec4(14, 1, 2, 3)",
														/* Utils::GEOMETRY_SHADER */
														"ivec4(15, 1, 2, 3)",
														/* Utils::FRAGMENT_SHADER */
														"ivec4(12, 1, 2, 3)"
	};

	static const GLchar* line_numbering_snippet = "ivec4 glsl\\\n"
												  "Test\\\n"
												  "Function(in ivec3 arg)\n"
												  "{\n"
												  "    return ivec4(__LINE__, arg.xyz);\n"
												  "}\n";

	static const GLchar* compute_shader_template =
		"VERSION\n"
		"\n"
		"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
		"\n"
		"writeonly uniform image2D uni_image;\n"
		"\n"
		"GLSL_TEST_FUNCTION"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(1, 0, 0, 1);\n"
		"\n"
		"    if (GLSL_TEST_RESULT == glslTestFunction(ivec3(1, 2, 3)))\n"
		"    {\n"
		"        result = vec4(0, 1, 0, 1);\n"
		"    }\n"
		"\n"
		"    imageStore(uni_image, ivec2(gl_GlobalInvocationID.xy), result);\n"
		"}\n"
		"\n";

	static const GLchar* fragment_shader_template =
		"VERSION\n"
		"\n"
		"in  vec4 gs_fs_result;\n"
		"out vec4 fs_out_result;\n"
		"\n"
		"GLSL_TEST_FUNCTION"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(1, 0, 0, 1);\n"
		"\n"
		"    if ((GLSL_TEST_RESULT == glslTestFunction(ivec3(1, 2, 3))) &&\n"
		"        (vec4(0, 1, 0, 1) == gs_fs_result) )\n"
		"    {\n"
		"         result = vec4(0, 1, 0, 1);\n"
		"    }\n"
		"\n"
		"    fs_out_result = result;\n"
		"}\n"
		"\n";

	static const GLchar* geometry_shader_template =
		"VERSION\n"
		"\n"
		"layout(points)                           in;\n"
		"layout(triangle_strip, max_vertices = 4) out;\n"
		"\n"
		"in  vec4 tes_gs_result[];\n"
		"out vec4 gs_fs_result;\n"
		"\n"
		"GLSL_TEST_FUNCTION"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(1, 0, 0, 1);\n"
		"\n"
		"    if ((GLSL_TEST_RESULT == glslTestFunction(ivec3(1, 2, 3))) &&\n"
		"        (vec4(0, 1, 0, 1) == tes_gs_result[0]) )\n"
		"    {\n"
		"         result = vec4(0, 1, 0, 1);\n"
		"    }\n"
		"\n"
		"    gs_fs_result = result;\n"
		"    gl_Position  = vec4(-1, -1, 0, 1);\n"
		"    EmitVertex();\n"
		"    gs_fs_result = result;\n"
		"    gl_Position  = vec4(-1, 1, 0, 1);\n"
		"    EmitVertex();\n"
		"    gs_fs_result = result;\n"
		"    gl_Position  = vec4(1, -1, 0, 1);\n"
		"    EmitVertex();\n"
		"    gs_fs_result = result;\n"
		"    gl_Position  = vec4(1, 1, 0, 1);\n"
		"    EmitVertex();\n"
		"}\n"
		"\n";

	static const GLchar* tess_ctrl_shader_template =
		"VERSION\n"
		"\n"
		"layout(vertices = 1) out;\n"
		"\n"
		"in  vec4 vs_tcs_result[];\n"
		"out vec4 tcs_tes_result[];\n"
		"\n"
		"GLSL_TEST_FUNCTION"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(1, 0, 0, 1);\n"
		"\n"
		"    if ((GLSL_TEST_RESULT == glslTestFunction(ivec3(1, 2, 3))) &&\n"
		"        (vec4(0, 1, 0, 1) == vs_tcs_result[gl_InvocationID]) )\n"
		"    {\n"
		"         result = vec4(0, 1, 0, 1);\n"
		"    }\n"
		"\n"
		"    tcs_tes_result[gl_InvocationID] = result;\n"
		"\n"
		"    gl_TessLevelOuter[0] = 1.0;\n"
		"    gl_TessLevelOuter[1] = 1.0;\n"
		"    gl_TessLevelOuter[2] = 1.0;\n"
		"    gl_TessLevelOuter[3] = 1.0;\n"
		"    gl_TessLevelInner[0] = 1.0;\n"
		"    gl_TessLevelInner[1] = 1.0;\n"
		"}\n"
		"\n";

	static const GLchar* tess_eval_shader_template =
		"VERSION\n"
		"\n"
		"layout(isolines, point_mode) in;\n"
		"\n"
		"in  vec4 tcs_tes_result[];\n"
		"out vec4 tes_gs_result;\n"
		"\n"
		"GLSL_TEST_FUNCTION"
		"\n"
		"void main()\n"
		"{\n"
		"    vec4 result = vec4(1, 0, 0, 1);\n"
		"\n"
		"    if ((GLSL_TEST_RESULT == glslTestFunction(ivec3(1, 2, 3))) &&\n"
		"        (vec4(0, 1, 0, 1) == tcs_tes_result[0]) )\n"
		"    {\n"
		"         result = vec4(0, 1, 0, 1);\n"
		"    }\n"
		"\n"
		"    tes_gs_result = result;\n"
		"}\n"
		"\n";

	static const GLchar* vertex_shader_template = "VERSION\n"
												  "\n"
												  "out vec4 vs_tcs_result;\n"
												  "\n"
												  "GLSL_TEST_FUNCTION"
												  "\n"
												  "void main()\n"
												  "{\n"
												  "    vec4 result = vec4(1, 0, 0, 1);\n"
												  "\n"
												  "    if (GLSL_TEST_RESULT == glslTestFunction(ivec3(1, 2, 3)))\n"
												  "    {\n"
												  "         result = vec4(0, 1, 0, 1);\n"
												  "    }\n"
												  "\n"
												  "    vs_tcs_result = result;\n"
												  "}\n"
												  "\n";

	const GLchar* shader_template = 0;

	switch (in_stage)
	{
	case Utils::COMPUTE_SHADER:
		shader_template = compute_shader_template;
		break;
	case Utils::FRAGMENT_SHADER:
		shader_template = fragment_shader_template;
		break;
	case Utils::GEOMETRY_SHADER:
		shader_template = geometry_shader_template;
		break;
	case Utils::TESS_CTRL_SHADER:
		shader_template = tess_ctrl_shader_template;
		break;
	case Utils::TESS_EVAL_SHADER:
		shader_template = tess_eval_shader_template;
		break;
	case Utils::VERTEX_SHADER:
		shader_template = vertex_shader_template;
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	out_source.m_parts[0].m_code = shader_template;

	size_t position = 0;
	Utils::replaceToken("VERSION", position, getVersionString(in_stage, in_use_version_400),
						out_source.m_parts[0].m_code);

	Utils::replaceToken("GLSL_TEST_FUNCTION", position, line_numbering_snippet, out_source.m_parts[0].m_code);

	Utils::replaceToken("GLSL_TEST_RESULT", position,
						in_use_version_400 ? test_result_snippet_400[in_stage] : test_result_snippet_normal[in_stage],
						out_source.m_parts[0].m_code);
}